

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O3

void UnitTest::CheckEqual<char[9],FIX::AllocID>
               (TestResults *results,char (*expected) [9],AllocID *actual,TestDetails *details)

{
  int iVar1;
  size_t sVar2;
  char *failure;
  MemoryOutStream stream;
  undefined1 local_1c0 [408];
  
  iVar1 = std::__cxx11::string::compare
                    ((char *)&(actual->super_StringField).super_FieldBase.m_string);
  if (iVar1 != 0) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c0);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,"Expected ",9);
    sVar2 = strlen(*expected);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0,*expected,sVar2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1c0," but was ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1c0,
               (actual->super_StringField).super_FieldBase.m_string._M_dataplus._M_p,
               (actual->super_StringField).super_FieldBase.m_string._M_string_length);
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c0);
    TestResults::OnTestFailure(results,details,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c0,&MemoryOutStream::VTT);
    std::ios_base::~ios_base((ios_base *)(local_1c0 + 0x90));
  }
  return;
}

Assistant:

void CheckEqual(TestResults& results, Expected const& expected, Actual const& actual, TestDetails const& details)
{
    if (!(expected == actual))
    {
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}